

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

VkFragmentShadingRateCombinerOpKHR
Diligent::ShadingRateCombinerToVkFragmentShadingRateCombinerOp(SHADING_RATE_COMBINER Combiner)

{
  bool bVar1;
  Char *pCVar2;
  undefined1 local_60 [8];
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  SHADING_RATE_COMBINER Combiner_local;
  
  msg.field_2._M_local_buf[0xb] = Combiner;
  bVar1 = IsPowerOfTwo<unsigned_int>((uint)Combiner);
  if (!bVar1) {
    FormatString<char[40]>
              ((string *)local_30,(char (*) [40])"Only single combiner should be provided");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"ShadingRateCombinerToVkFragmentShadingRateCombinerOp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x786);
    std::__cxx11::string::~string((string *)local_30);
  }
  switch(msg.field_2._M_local_buf[0xb]) {
  case '\x01':
    msg.field_2._12_4_ = 0;
    break;
  case '\x02':
    msg.field_2._12_4_ = 1;
    break;
  default:
    FormatString<char[33]>((string *)local_60,(char (*) [33])"Unexpected shading rate combiner");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"ShadingRateCombinerToVkFragmentShadingRateCombinerOp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x792);
    std::__cxx11::string::~string((string *)local_60);
    msg.field_2._12_4_ = 0x7fffffff;
    break;
  case '\x04':
    msg.field_2._12_4_ = 2;
    break;
  case '\b':
    msg.field_2._12_4_ = 3;
    break;
  case '\x10':
  case ' ':
    msg.field_2._12_4_ = 4;
  }
  return msg.field_2._12_4_;
}

Assistant:

VkFragmentShadingRateCombinerOpKHR ShadingRateCombinerToVkFragmentShadingRateCombinerOp(SHADING_RATE_COMBINER Combiner)
{
    static_assert(SHADING_RATE_COMBINER_LAST == (1u << 5), "Please update the switch below to handle the new shading rate combiner");
    VERIFY(IsPowerOfTwo(Uint32{Combiner}), "Only single combiner should be provided");
    switch (Combiner)
    {
        // clang-format off
        case SHADING_RATE_COMBINER_PASSTHROUGH: return VK_FRAGMENT_SHADING_RATE_COMBINER_OP_KEEP_KHR;
        case SHADING_RATE_COMBINER_OVERRIDE:    return VK_FRAGMENT_SHADING_RATE_COMBINER_OP_REPLACE_KHR;
        case SHADING_RATE_COMBINER_MIN:         return VK_FRAGMENT_SHADING_RATE_COMBINER_OP_MIN_KHR;
        case SHADING_RATE_COMBINER_MAX:         return VK_FRAGMENT_SHADING_RATE_COMBINER_OP_MAX_KHR;
        case SHADING_RATE_COMBINER_SUM:
        case SHADING_RATE_COMBINER_MUL:         return VK_FRAGMENT_SHADING_RATE_COMBINER_OP_MUL_KHR;
        // clang-format on
        default:
            UNEXPECTED("Unexpected shading rate combiner");
            return VK_FRAGMENT_SHADING_RATE_COMBINER_OP_MAX_ENUM_KHR;
    }
}